

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_data_source_set_looping(ma_data_source *pDataSource,ma_bool32 isLooping)

{
  ma_result mVar1;
  
  if (pDataSource == (ma_data_source *)0x0) {
    return MA_INVALID_ARGS;
  }
  LOCK();
  *(ma_bool32 *)((long)pDataSource + 0x40) = isLooping;
  UNLOCK();
  if (*(code **)(*pDataSource + 0x28) != (code *)0x0) {
    mVar1 = (**(code **)(*pDataSource + 0x28))();
    return mVar1;
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_data_source_set_looping(ma_data_source* pDataSource, ma_bool32 isLooping)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    c89atomic_exchange_32(&pDataSourceBase->isLooping, isLooping);

    /* If there's no callback for this just treat it as a successful no-op. */
    if (pDataSourceBase->vtable->onSetLooping == NULL) {
        return MA_SUCCESS;
    }

    return pDataSourceBase->vtable->onSetLooping(pDataSource, isLooping);
}